

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate_stream.cpp
# Opt level: O0

void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor *c)

{
  runner **pprVar1;
  invalid_argument *anon_var_0_3;
  invalid_argument *anon_var_0_2;
  invalid_argument *anon_var_0_1;
  invalid_argument *anon_var_0;
  invalid_argument *local_10;
  ICompressor *c_local;
  
  local_10 = (invalid_argument *)c;
  (*c->_vptr_ICompressor[1])(c,0xffffffd6,0xf,8,0);
  pprVar1 = test_suite::detail::current();
  (*(*pprVar1)->_vptr_runner[6])
            (*pprVar1,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1b6,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  (*(*(_func_int ***)local_10)[1])(local_10,0xffffffff,0xffffffff,8,0);
  pprVar1 = test_suite::detail::current();
  (*(*pprVar1)->_vptr_runner[6])
            (*pprVar1,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1b9,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  (*(*(_func_int ***)local_10)[1])(local_10,0xffffffff,0xf,0xffffffff,0);
  pprVar1 = test_suite::detail::current();
  (*(*pprVar1)->_vptr_runner[6])
            (*pprVar1,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1bc,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  anon_var_0_3 = local_10;
  testInvalidSettings::anon_class_8_1_54a39803::operator()((anon_class_8_1_54a39803 *)&anon_var_0_3)
  ;
  pprVar1 = test_suite::detail::current();
  (*(*pprVar1)->_vptr_runner[6])
            (*pprVar1,"std::invalid_argument",
             "/workspace/llm4binary/github/license_all_cmakelists_25/ryanjanson[P]Deflate/test/deflate_stream.cpp"
             ,0x1c5,
             "static void boost::deflate::deflate_stream_test::testInvalidSettings(ICompressor &)");
  return;
}

Assistant:

static
    void testInvalidSettings(ICompressor& c)
    {
        BOOST_TEST_THROWS(
            c.init(-42, 15, 8, static_cast<int>(Strategy::normal)), 
            std::invalid_argument);
        BOOST_TEST_THROWS(
            c.init(compression::default_size, -1, 8, static_cast<int>(Strategy::normal)),
            std::invalid_argument);
        BOOST_TEST_THROWS(
            c.init(compression::default_size, 15, -1, static_cast<int>(Strategy::normal)),
            std::invalid_argument);

        BOOST_TEST_THROWS(
            [&]()
            {
                c.init();
                c.avail_in(1);
                c.next_in(nullptr);
                c.write(Flush::full);
            }(), std::invalid_argument);
    }